

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageSetAAPixelColor(gdImagePtr im,int x,int y,int color,int t)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if ((((im->cy1 <= y) && (y <= im->cy2)) && (im->cx1 <= x)) &&
     (((x <= im->cx2 && (uVar1 = gdImageGetPixel(im,x,y), uVar1 != color)) &&
      ((t == 0 || (uVar1 != im->AA_dont_blend)))))) {
    uVar6 = (uint)color >> 0x10 & 0xff;
    uVar3 = (uint)color >> 8 & 0xff;
    uVar4 = ((uVar1 >> 0x10 & 0xff) - uVar6) * t;
    iVar5 = ((uVar1 >> 8 & 0xff) - uVar3) * t;
    iVar2 = ((uVar1 & 0xff) - (color & 0xffU)) * t;
    im->tpixels[y][x] =
         (iVar2 + 0x80 + (iVar2 >> 8) >> 8) + (color & 0xffU) +
         (uVar3 * 0x100 + iVar5 + (iVar5 >> 8) + 0x80 & 0xffffff00) +
         ((uVar4 + 0x80 + (uVar4 >> 8) >> 8) + uVar6) * 0x10000;
  }
  return;
}

Assistant:

static void gdImageSetAAPixelColor(gdImagePtr im, int x, int y, int color, int t)
{
	int dr,dg,db,p,r,g,b;

	/* 2.0.34: watch out for out of range calls */
	if (!gdImageBoundsSafeMacro(im, x, y)) {
		return;
	}
	p = gdImageGetPixel(im,x,y);
	/* TBB: we have to implement the dont_blend stuff to provide
	  the full feature set of the old implementation */
	if ((p == color)
	        || ((p == im->AA_dont_blend)
	            && (t != 0x00))) {
		return;
	}
	dr = gdTrueColorGetRed(color);
	dg = gdTrueColorGetGreen(color);
	db = gdTrueColorGetBlue(color);

	r = gdTrueColorGetRed(p);
	g = gdTrueColorGetGreen(p);
	b = gdTrueColorGetBlue(p);

	BLEND_COLOR(t, dr, r, dr);
	BLEND_COLOR(t, dg, g, dg);
	BLEND_COLOR(t, db, b, db);
	im->tpixels[y][x] = gdTrueColorAlpha(dr, dg, db, gdAlphaOpaque);
}